

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t *
container_lazy_xor(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  array_container_t *paVar4;
  container_t *result;
  run_container_t *local_20;
  
  uVar3 = (uint)CONCAT71(in_register_00000031,type1);
  if (uVar3 == 4) {
    uVar3 = (uint)*(byte *)((long)c1 + 8);
    if (*(byte *)((long)c1 + 8) == 4) goto LAB_0010af6c;
    c1 = *c1;
  }
  if (type2 == '\x04') {
    type2 = *(byte *)((long)c2 + 8);
    if (type2 == 4) {
LAB_0010af6c:
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    c2 = *c2;
  }
  local_20 = (run_container_t *)0x0;
  switch((uint)type2 + (uVar3 & 0xff) * 4) {
  case 5:
    local_20 = (run_container_t *)bitset_container_create();
    bitset_container_xor_nocard
              ((bitset_container_t *)c1,(bitset_container_t *)c2,(bitset_container_t *)local_20);
    goto LAB_0010af31;
  case 6:
    local_20 = (run_container_t *)bitset_container_create();
    *result_type = '\x01';
    paVar4 = (array_container_t *)c1;
    goto LAB_0010af0f;
  case 7:
    local_20 = (run_container_t *)bitset_container_create();
    paVar4 = (array_container_t *)c1;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1690,
                  "container_t *container_lazy_xor(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    local_20 = (run_container_t *)bitset_container_create();
    *result_type = '\x01';
    paVar4 = (array_container_t *)c2;
    c2 = c1;
LAB_0010af0f:
    array_bitset_container_lazy_xor
              ((array_container_t *)c2,(bitset_container_t *)paVar4,(bitset_container_t *)local_20);
    return local_20;
  case 10:
    _Var1 = array_array_container_lazy_xor
                      ((array_container_t *)c1,(array_container_t *)c2,&local_20);
    *result_type = '\x02' - _Var1;
    return local_20;
  case 0xb:
    local_20 = (run_container_t *)malloc(0x10);
    paVar4 = (array_container_t *)c2;
    if (local_20 == (run_container_t *)0x0) {
      local_20 = (run_container_t *)0x0;
    }
    else {
      local_20->n_runs = 0;
      local_20->capacity = 0;
      local_20->runs = (rle16_t *)0x0;
    }
    goto LAB_0010af52;
  case 0xd:
    local_20 = (run_container_t *)bitset_container_create();
    paVar4 = (array_container_t *)c2;
    c2 = c1;
    break;
  case 0xe:
    local_20 = (run_container_t *)malloc(0x10);
    paVar4 = (array_container_t *)c1;
    c1 = c2;
    if (local_20 == (run_container_t *)0x0) {
      local_20 = (run_container_t *)0x0;
    }
    else {
      local_20->n_runs = 0;
      local_20->capacity = 0;
      local_20->runs = (rle16_t *)0x0;
    }
LAB_0010af52:
    array_run_container_lazy_xor((array_container_t *)c1,(run_container_t *)paVar4,local_20);
    *result_type = '\x03';
    return local_20;
  case 0xf:
    iVar2 = run_run_container_xor((run_container_t *)c1,(run_container_t *)c2,&local_20);
    *result_type = (uint8_t)iVar2;
    return local_20;
  }
  run_bitset_container_lazy_xor
            ((run_container_t *)c2,(bitset_container_t *)paVar4,(bitset_container_t *)local_20);
LAB_0010af31:
  *result_type = '\x01';
  return local_20;
}

Assistant:

static inline container_t *container_lazy_xor(
    const container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            result = bitset_container_create();
            bitset_container_xor_nocard(
                const_CAST_bitset(c1), const_CAST_bitset(c2),
                CAST_bitset(result));  // is lazy
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            *result_type = array_array_container_lazy_xor(
                                const_CAST_array(c1),
                                const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            // nothing special done yet.
            *result_type =
                run_run_container_xor(const_CAST_run(c1),
                                      const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(BITSET,ARRAY):
            result = bitset_container_create();
            *result_type = BITSET_CONTAINER_TYPE;
            array_bitset_container_lazy_xor(const_CAST_array(c2),
                                            const_CAST_bitset(c1),
                                            CAST_bitset(result));
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            result = bitset_container_create();
            *result_type = BITSET_CONTAINER_TYPE;
            array_bitset_container_lazy_xor(const_CAST_array(c1),
                                            const_CAST_bitset(c2),
                                            CAST_bitset(result));
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            result = bitset_container_create();
            run_bitset_container_lazy_xor(const_CAST_run(c2),
                                          const_CAST_bitset(c1),
                                          CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            result = bitset_container_create();
            run_bitset_container_lazy_xor(const_CAST_run(c1),
                                          const_CAST_bitset(c2),
                                          CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            result = run_container_create();
            array_run_container_lazy_xor(const_CAST_array(c1),
                                         const_CAST_run(c2),
                                         CAST_run(result));
            *result_type = RUN_CONTAINER_TYPE;
            // next line skipped since we are lazy
            // result = convert_run_to_efficient_container(result, result_type);
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            result = run_container_create();
            array_run_container_lazy_xor(const_CAST_array(c2),
                                         const_CAST_run(c1),
                                         CAST_run(result));
            *result_type = RUN_CONTAINER_TYPE;
            // next line skipped since we are lazy
            // result = convert_run_to_efficient_container(result, result_type);
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;  // unreached
    }
}